

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

Value * resizearray(lua_State *L,Table *t,uint oldasize,uint newasize)

{
  void *pvVar1;
  Value *nsize;
  Value *osize;
  Value *pVVar2;
  Value *pVVar3;
  bool bVar4;
  
  if (oldasize == newasize) {
    pVVar3 = t->array;
  }
  else {
    if (newasize == 0) {
      pVVar2 = t->array + -(ulong)oldasize;
      pVVar3 = (Value *)0x0;
      osize = (Value *)((ulong)oldasize * 9 + 4);
      if (oldasize == 0) {
        osize = pVVar3;
      }
    }
    else {
      nsize = (Value *)((ulong)newasize * 9 + 4);
      pvVar1 = luaM_realloc_(L,(void *)0x0,0,(size_t)nsize);
      if (pvVar1 == (void *)0x0) {
        return (Value *)0x0;
      }
      pVVar3 = (Value *)((long)pvVar1 + (ulong)newasize * 8);
      if (oldasize == 0) {
        return pVVar3;
      }
      osize = (Value *)((ulong)oldasize * 9 + 4);
      bVar4 = oldasize < newasize;
      if (bVar4) {
        newasize = oldasize;
      }
      pVVar2 = t->array;
      if (bVar4) {
        nsize = osize;
      }
      memcpy(pVVar3 + -(ulong)newasize,pVVar2 + -(ulong)newasize,(size_t)nsize);
      pVVar2 = pVVar2 + -(ulong)oldasize;
    }
    luaM_free_(L,pVVar2,(size_t)osize);
  }
  return pVVar3;
}

Assistant:

static Value *resizearray (lua_State *L , Table *t,
                               unsigned oldasize,
                               unsigned newasize) {
  if (oldasize == newasize)
    return t->array;  /* nothing to be done */
  else if (newasize == 0) {  /* erasing array? */
    Value *op = t->array - oldasize;  /* original array's real address */
    luaM_freemem(L, op, concretesize(oldasize));  /* free it */
    return NULL;
  }
  else {
    size_t newasizeb = concretesize(newasize);
    Value *np = cast(Value *,
                  luaM_reallocvector(L, NULL, 0, newasizeb, lu_byte));
    if (np == NULL)  /* allocation error? */
      return NULL;
    np += newasize;  /* shift pointer to the end of value segment */
    if (oldasize > 0) {
      /* move common elements to new position */
      size_t oldasizeb = concretesize(oldasize);
      Value *op = t->array;  /* original array */
      unsigned tomove = (oldasize < newasize) ? oldasize : newasize;
      size_t tomoveb = (oldasize < newasize) ? oldasizeb : newasizeb;
      lua_assert(tomoveb > 0);
      memcpy(np - tomove, op - tomove, tomoveb);
      luaM_freemem(L, op - oldasize, oldasizeb);  /* free old block */
    }
    return np;
  }
}